

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O0

DecoratorDataHandle __thiscall
Rml::DecoratorNinePatch::GenerateElementData
          (DecoratorNinePatch *this,Element *element,BoxArea paint_area)

{
  float fVar1;
  float fVar2;
  int iVar3;
  NumericValue value;
  NumericValue value_00;
  NumericValue value_01;
  bool bVar4;
  int iVar5;
  ComputedValues *this_00;
  type paVar6;
  reference pvVar7;
  float *pfVar8;
  reference pvVar9;
  RenderManager *this_01;
  RenderManager *mesh_00;
  float fVar10;
  float fVar11;
  float fVar12;
  Vector2<float> rhs;
  Vector2f rhs_00;
  Vector2<float> VVar13;
  Vector2<float> *local_2d8;
  Vector2<float> *local_298;
  Geometry *data;
  int top_left_index;
  int i_2;
  int rectangle;
  int top_left_indices [9];
  Vector2f local_248;
  reference local_240;
  Vertex *vertex;
  int local_230;
  int x;
  int y;
  pointer *local_220;
  Vector<int> *indices;
  Vector<Vertex> *vertices;
  Mesh mesh;
  Vector2f *surface_pos_entry;
  Vector2f *__end1;
  Vector2f *__begin1;
  Vector2f (*__range1) [4];
  float bottom_right_size;
  float top_left_size;
  int i_1;
  Vector2<float> local_190;
  Vector2f surface_center_size;
  float lengths [4];
  Vector2<float> local_150;
  Vector2<float> local_148;
  Vector2<float> local_140;
  Vector2f local_138;
  Vector2<float> local_130;
  Vector2<float> local_128;
  Vector2<float> local_120;
  Vector2<float> local_118;
  Vector2f surface_pos [4];
  float scale_raw_to_natural_dimensions;
  int local_dc;
  int i;
  Vector2f tex_coords [4];
  Vector2f tex_pos [4];
  Colourb local_90;
  Colour<unsigned_char,_255,_true> local_8c;
  float fStack_88;
  ColourbPremultiplied quad_colour;
  Vector2f surface_dimensions;
  Vector2f surface_offset;
  RenderBox render_box;
  Vector2f texture_dimensions;
  Texture texture;
  ComputedValues *computed;
  BoxArea paint_area_local;
  Element *element_local;
  DecoratorNinePatch *this_local;
  
  this_00 = Element::GetComputedValues(element);
  _texture_dimensions = Decorator::GetTexture(&this->super_Decorator,0);
  render_box.border_radius._M_elems._8_8_ = Texture::GetDimensions((Texture *)&texture_dimensions);
  rhs = Vector2::operator_cast_to_Vector2((Vector2 *)(render_box.border_radius._M_elems + 2));
  Element::GetRenderBox((RenderBox *)&surface_offset,element,paint_area,0);
  rhs_00 = RenderBox::GetFillOffset((RenderBox *)&surface_offset);
  _fStack_88 = RenderBox::GetFillSize((RenderBox *)&surface_offset);
  local_90 = Style::ComputedValues::image_color(this_00);
  fVar10 = Style::ComputedValues::opacity(this_00);
  local_8c = Colour<unsigned_char,255,false>::
             ToPremultiplied<std::integral_constant<bool,false>,void>
                       ((Colour<unsigned_char,255,false> *)&local_90,fVar10);
  tex_coords[3] = Rectangle<float>::TopLeft(&this->rect_outer);
  tex_pos[0] = Rectangle<float>::TopLeft(&this->rect_inner);
  tex_pos[1] = Rectangle<float>::BottomRight(&this->rect_inner);
  tex_pos[2] = Rectangle<float>::BottomRight(&this->rect_outer);
  local_298 = (Vector2<float> *)&stack0xffffffffffffff28;
  do {
    Vector2<float>::Vector2(local_298);
    local_298 = local_298 + 1;
  } while (local_298 != tex_coords + 3);
  for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
    VVar13 = Vector2<float>::operator/(tex_coords + (long)local_dc + 3,rhs);
    *(Vector2<float> *)(&stack0xffffffffffffff28 + (long)local_dc * 8) = VVar13;
  }
  fVar10 = ElementUtilities::GetDensityIndependentPixelRatio(element);
  surface_pos[3].y = fVar10 * this->display_scale;
  local_2d8 = &local_118;
  do {
    Vector2<float>::Vector2(local_2d8);
    local_2d8 = local_2d8 + 1;
  } while (local_2d8 != surface_pos + 3);
  Vector2<float>::Vector2(&local_120,0.0,0.0);
  local_118 = local_120;
  local_138 = tex_coords[3];
  local_130 = Vector2<float>::operator-(tex_pos,tex_coords[3]);
  local_128 = Vector2<float>::operator*(&local_130,surface_pos[3].y);
  surface_pos[0] = local_128;
  local_150 = Vector2<float>::operator-(tex_pos + 2,tex_pos[1]);
  local_148 = Vector2<float>::operator*(&local_150,surface_pos[3].y);
  local_140 = Vector2<float>::operator-((Vector2<float> *)&stack0xffffffffffffff78,local_148);
  surface_pos[2] = _fStack_88;
  surface_pos[1] = local_140;
  bVar4 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->edges);
  if (bVar4) {
    paVar6 = ::std::
             unique_ptr<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
             ::operator*(&this->edges);
    pvVar7 = ::std::array<Rml::NumericValue,_4UL>::operator[](paVar6,0);
    value.number = pvVar7->number;
    value.unit = pvVar7->unit;
    fVar10 = Element::ResolveNumericValue(element,value,surface_pos[0].y - local_118.y);
    paVar6 = ::std::
             unique_ptr<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
             ::operator*(&this->edges);
    pvVar7 = ::std::array<Rml::NumericValue,_4UL>::operator[](paVar6,1);
    value_00.number = pvVar7->number;
    value_00.unit = pvVar7->unit;
    fVar11 = Element::ResolveNumericValue(element,value_00,surface_pos[2].x - surface_pos[1].x);
    paVar6 = ::std::
             unique_ptr<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
             ::operator*(&this->edges);
    pvVar7 = ::std::array<Rml::NumericValue,_4UL>::operator[](paVar6,2);
    value_01.number = pvVar7->number;
    value_01.unit = pvVar7->unit;
    fVar12 = Element::ResolveNumericValue(element,value_01,surface_pos[2].y - surface_pos[1].y);
    paVar6 = ::std::
             unique_ptr<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
             ::operator*(&this->edges);
    pvVar7 = ::std::array<Rml::NumericValue,_4UL>::operator[](paVar6,3);
    surface_center_size.x = pvVar7->number;
    surface_center_size.y = pvVar7->unit;
    surface_pos[0].x =
         Element::ResolveNumericValue
                   (element,(NumericValue)surface_center_size,surface_pos[0].x - local_118.x);
    surface_pos[1].y = (float)quad_colour - fVar12;
    surface_pos[1].x = fStack_88 - fVar11;
    surface_pos[0].y = fVar10;
  }
  local_190 = Vector2<float>::operator-(surface_pos + 1,surface_pos[0]);
  for (bottom_right_size = 0.0; (int)bottom_right_size < 2;
      bottom_right_size = (float)((int)bottom_right_size + 1)) {
    pfVar8 = Vector2::operator_cast_to_float_((Vector2 *)&local_190);
    if (pfVar8[(int)bottom_right_size] <= 0.0 && pfVar8[(int)bottom_right_size] != 0.0) {
      pfVar8 = Vector2::operator_cast_to_float_((Vector2 *)tex_pos);
      fVar10 = pfVar8[(int)bottom_right_size];
      pfVar8 = Vector2::operator_cast_to_float_((Vector2 *)(tex_coords + 3));
      fVar11 = pfVar8[(int)bottom_right_size];
      pfVar8 = Vector2::operator_cast_to_float_((Vector2 *)(tex_pos + 2));
      fVar12 = pfVar8[(int)bottom_right_size];
      pfVar8 = Vector2::operator_cast_to_float_((Vector2 *)(tex_pos + 1));
      fVar1 = pfVar8[(int)bottom_right_size];
      pfVar8 = Vector2::operator_cast_to_float_((Vector2 *)&stack0xffffffffffffff78);
      fVar2 = pfVar8[(int)bottom_right_size];
      pfVar8 = Vector2::operator_cast_to_float_((Vector2 *)surface_pos);
      pfVar8[(int)bottom_right_size] =
           ((fVar10 - fVar11) / ((fVar10 - fVar11) + (fVar12 - fVar1))) * fVar2;
      pfVar8 = Vector2::operator_cast_to_float_((Vector2 *)surface_pos);
      fVar10 = pfVar8[(int)bottom_right_size];
      pfVar8 = Vector2::operator_cast_to_float_((Vector2 *)(surface_pos + 1));
      pfVar8[(int)bottom_right_size] = fVar10;
    }
  }
  for (__end1 = &local_118; __end1 != surface_pos + 3; __end1 = __end1 + 1) {
    Vector2<float>::operator+=(__end1,rhs_00);
  }
  surface_pos[0] = Vector2<float>::Round(surface_pos);
  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Vector2<float>::Round(surface_pos + 1);
  surface_pos[1] =
       (Vector2f)
       mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  Mesh::Mesh((Mesh *)&vertices);
  local_220 = &mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  indices = (Vector<int> *)&vertices;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize
            ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)&vertices,0x10);
  for (local_230 = 0; local_230 < 4; local_230 = local_230 + 1) {
    for (vertex._4_4_ = 0; vertex._4_4_ < 4; vertex._4_4_ = vertex._4_4_ + 1) {
      local_240 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                            ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)indices,
                             (long)(vertex._4_4_ + local_230 * 4));
      (local_240->colour).red = local_8c.red;
      (local_240->colour).green = local_8c.green;
      (local_240->colour).blue = local_8c.blue;
      (local_240->colour).alpha = local_8c.alpha;
      Vector2<float>::Vector2
                (&local_248,surface_pos[(long)vertex._4_4_ + -1].x,
                 surface_pos[(long)local_230 + -1].y);
      local_240->position = local_248;
      Vector2<float>::Vector2
                ((Vector2<float> *)(top_left_indices + 8),
                 *(float *)(&stack0xffffffffffffff28 + (long)vertex._4_4_ * 8),
                 tex_coords[(long)local_230 + -1].y);
      local_240->tex_coord = stack0xfffffffffffffdb0;
    }
  }
  ::std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_220,0x36);
  memcpy(&i_2,&DAT_0070e9c0,0x24);
  for (top_left_index = 0; top_left_index < 9; top_left_index = top_left_index + 1) {
    iVar5 = top_left_index * 6;
    iVar3 = (&i_2)[top_left_index];
    pvVar9 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_220,(long)iVar5);
    *pvVar9 = iVar3;
    pvVar9 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_220,(long)(iVar5 + 1));
    *pvVar9 = iVar3 + 4;
    pvVar9 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_220,(long)(iVar5 + 2));
    *pvVar9 = iVar3 + 1;
    pvVar9 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_220,(long)(iVar5 + 3));
    *pvVar9 = iVar3 + 1;
    pvVar9 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_220,(long)(iVar5 + 4));
    *pvVar9 = iVar3 + 4;
    pvVar9 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_220,(long)(iVar5 + 5));
    *pvVar9 = iVar3 + 5;
  }
  this_01 = (RenderManager *)operator_new(0x10);
  mesh_00 = Element::GetRenderManager(element);
  RenderManager::MakeGeometry(this_01,(Mesh *)mesh_00);
  Mesh::~Mesh((Mesh *)&vertices);
  return (DecoratorDataHandle)this_01;
}

Assistant:

DecoratorDataHandle DecoratorNinePatch::GenerateElementData(Element* element, BoxArea paint_area) const
{
	const auto& computed = element->GetComputedValues();

	Texture texture = GetTexture();
	const Vector2f texture_dimensions(texture.GetDimensions());

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f surface_offset = render_box.GetFillOffset();
	const Vector2f surface_dimensions = render_box.GetFillSize();

	const ColourbPremultiplied quad_colour = computed.image_color().ToPremultiplied(computed.opacity());

	/* In the following, we operate on the four diagonal vertices in the grid, as they define the whole grid. */

	// Absolute texture coordinates 'px'
	Vector2f tex_pos[4] = {
		rect_outer.TopLeft(),
		rect_inner.TopLeft(),
		rect_inner.BottomRight(),
		rect_outer.BottomRight(),
	};

	// Normalized texture coordinates [0, 1]
	Vector2f tex_coords[4];
	for (int i = 0; i < 4; i++)
		tex_coords[i] = tex_pos[i] / texture_dimensions;

	// Natural size is determined from the raw pixel size multiplied by the dp-ratio and the sprite's
	// display scale (determined by eg. the inverse of spritesheet's 'src-scale').
	const float scale_raw_to_natural_dimensions = ElementUtilities::GetDensityIndependentPixelRatio(element) * display_scale;

	// Surface position in pixels [0, surface_dimensions]
	// Need to keep the corner patches at their natural size, but stretch the inner patches.
	Vector2f surface_pos[4];
	surface_pos[0] = {0, 0};
	surface_pos[1] = (tex_pos[1] - tex_pos[0]) * scale_raw_to_natural_dimensions;
	surface_pos[2] = surface_dimensions - (tex_pos[3] - tex_pos[2]) * scale_raw_to_natural_dimensions;
	surface_pos[3] = surface_dimensions;

	// Change the size of the edges if specified.
	if (edges)
	{
		float lengths[4]; // top, right, bottom, left
		lengths[0] = element->ResolveNumericValue((*edges)[0], (surface_pos[1].y - surface_pos[0].y));
		lengths[1] = element->ResolveNumericValue((*edges)[1], (surface_pos[3].x - surface_pos[2].x));
		lengths[2] = element->ResolveNumericValue((*edges)[2], (surface_pos[3].y - surface_pos[2].y));
		lengths[3] = element->ResolveNumericValue((*edges)[3], (surface_pos[1].x - surface_pos[0].x));

		surface_pos[1].y = lengths[0];
		surface_pos[2].x = surface_dimensions.x - lengths[1];
		surface_pos[2].y = surface_dimensions.y - lengths[2];
		surface_pos[1].x = lengths[3];
	}

	// In case the surface dimensions are less than the size of the corners, we need to scale down the corner rectangles, one dimension at a time.
	const Vector2f surface_center_size = surface_pos[2] - surface_pos[1];
	for (int i = 0; i < 2; i++)
	{
		if (surface_center_size[i] < 0.0f)
		{
			float top_left_size = tex_pos[1][i] - tex_pos[0][i];
			float bottom_right_size = tex_pos[3][i] - tex_pos[2][i];
			surface_pos[1][i] = top_left_size / (top_left_size + bottom_right_size) * surface_dimensions[i];
			surface_pos[2][i] = surface_pos[1][i];
		}
	}

	// Now offset all positions, relative to the border box.
	for (Vector2f& surface_pos_entry : surface_pos)
		surface_pos_entry += surface_offset;

	// Round the inner corners
	surface_pos[1] = surface_pos[1].Round();
	surface_pos[2] = surface_pos[2].Round();

	/* Now we have all the coordinates we need. Expand the diagonal vertices to the 16 individual vertices. */
	Mesh mesh;
	Vector<Vertex>& vertices = mesh.vertices;
	Vector<int>& indices = mesh.indices;

	vertices.resize(4 * 4);

	for (int y = 0; y < 4; y++)
	{
		for (int x = 0; x < 4; x++)
		{
			Vertex& vertex = vertices[y * 4 + x];
			vertex.colour = quad_colour;
			vertex.position = {surface_pos[x].x, surface_pos[y].y};
			vertex.tex_coord = {tex_coords[x].x, tex_coords[y].y};
		}
	}

	// Nine rectangles, two triangles per rectangle, three indices per triangle.
	indices.resize(9 * 2 * 3);

	// Fill in the indices one rectangle at a time.
	const int top_left_indices[9] = {0, 1, 2, 4, 5, 6, 8, 9, 10};
	for (int rectangle = 0; rectangle < 9; rectangle++)
	{
		int i = rectangle * 6;
		int top_left_index = top_left_indices[rectangle];
		indices[i] = top_left_index;
		indices[i + 1] = top_left_index + 4;
		indices[i + 2] = top_left_index + 1;
		indices[i + 3] = top_left_index + 1;
		indices[i + 4] = top_left_index + 4;
		indices[i + 5] = top_left_index + 5;
	}

	Geometry* data = new Geometry(element->GetRenderManager()->MakeGeometry(std::move(mesh)));

	return reinterpret_cast<DecoratorDataHandle>(data);
}